

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryStateUpdate::iterate
          (TransformFeedbackOverflowQueryStateUpdate *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar6;
  uint local_30;
  uint local_2c;
  GLuint j_1;
  GLuint j;
  GLuint i;
  Functions *gl;
  TransformFeedbackOverflowQueryStateUpdate *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryContextStateBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x20))(0x82ec,this->m_overflow_query);
  bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                    (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ec,0,
                     this->m_overflow_query);
  if (!bVar1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,
               "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not updated properly after a call to BeginQuery"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0x153);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x628))(0x82ec);
  bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                    (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ec,0,0);
  if (bVar1) {
    bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                      ((TransformFeedbackOverflowQueryBaseTest *)this);
    if (bVar1) {
      for (j_1 = 0; GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                                      ((TransformFeedbackOverflowQueryBaseTest *)this), j_1 < GVar3;
          j_1 = j_1 + 1) {
        (**(code **)(lVar5 + 0x28))(0x82ed,j_1,this->m_stream_overflow_query);
        for (local_2c = 0;
            GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                              ((TransformFeedbackOverflowQueryBaseTest *)this), local_2c < GVar3;
            local_2c = local_2c + 1) {
          if (j_1 == local_2c) {
            bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                              (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                               local_2c,this->m_stream_overflow_query);
            if (!bVar1) {
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is not updated properly after a call to BeginQueryIndexed"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                         ,0x170);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          else {
            bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                              (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                               local_2c,0);
            if (!bVar1) {
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is incorrectly updated for an unrelated vertex streamindex after a call to BeginQueryIndexed"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                         ,0x179);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
        }
        (**(code **)(lVar5 + 0x630))(0x82ed);
        for (local_30 = 0;
            GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                              ((TransformFeedbackOverflowQueryBaseTest *)this), local_30 < GVar3;
            local_30 = local_30 + 1) {
          if (j_1 == local_30) {
            bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                              (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                               local_30,0);
            if (!bVar1) {
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is not reset properly after a call to EndQueryIndexed"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                         ,0x189);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          else {
            bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                              (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                               local_30,0);
            if (!bVar1) {
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is incorrectly updated for an unrelated vertex streamindex after a call to EndQueryIndexed"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                         ,0x192);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
        }
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TransformFeedbackOverflowQueryContextStateBase).
               super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    return STOP;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,
             "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not reset properly after a call to EndQuery"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
             ,0x15d);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Call BeginQuery
		gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_overflow_query);

		// Verify that CURRENT_QUERY is set to the name of the query
		if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, m_overflow_query))
		{
			TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not updated properly "
					 "after a call to BeginQuery");
		}

		// Call EndQuery
		gl.endQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB);

		// Verify that CURRENT_QUERY is reset to zero
		if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, 0))
		{
			TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not reset properly "
					 "after a call to EndQuery");
		}

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				// Call BeginQueryIndexed with specified index
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_stream_overflow_query);

				// Verify that CURRENT_QUERY is set to the name of the query for the specified index, but remains zero for other indices
				for (GLuint j = 0; j < getMaxVertexStreams(); ++j)
				{
					if (i == j)
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j,
													 m_stream_overflow_query))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is not updated properly after a call to BeginQueryIndexed");
						}
					}
					else
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j, 0))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is incorrectly updated for an unrelated vertex stream"
									 "index after a call to BeginQueryIndexed");
						}
					}
				}

				// Call EndQueryIndexed with specified index
				gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i);

				// Verify that CURRENT_QUERY is reset to zero for the specified index and still remains zero for other indices
				for (GLuint j = 0; j < getMaxVertexStreams(); ++j)
				{
					if (i == j)
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j, 0))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is not reset properly after a call to EndQueryIndexed");
						}
					}
					else
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j, 0))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is incorrectly updated for an unrelated vertex stream"
									 "index after a call to EndQueryIndexed");
						}
					}
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}